

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_SB(DisasContext_conflict1 *s,arg_SB *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGContext_conflict1 *tcg_ctx;
  arg_SB *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_sb(s->isar);
  if (_Var1) {
    tcg_gen_mb_aarch64(tcg_ctx_00,TCG_BAR_SC|TCG_MO_ALL);
    gen_goto_tb(s,0,(s->base).pc_next);
  }
  return _Var1;
}

Assistant:

static bool trans_SB(DisasContext *s, arg_SB *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!dc_isar_feature(aa32_sb, s)) {
        return false;
    }
    /*
     * TODO: There is no speculation barrier opcode
     * for TCG; MB and end the TB instead.
     */
    tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_SC);
    gen_goto_tb(s, 0, s->base.pc_next);
    return true;
}